

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

OBJ_APPLY_DATA * new_apply_data(void)

{
  undefined1 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  OBJ_APPLY_DATA *app;
  OBJ_APPLY_DATA *local_8;
  
  if (apply_free == (OBJ_APPLY_DATA *)0x0) {
    local_8 = (OBJ_APPLY_DATA *)operator_new(0x10);
  }
  else {
    local_8 = apply_free;
    apply_free = apply_free->next;
  }
  uVar1 = new_apply_data::app_zero._1_1_;
  sVar2 = new_apply_data::app_zero.location;
  sVar3 = new_apply_data::app_zero.modifier;
  sVar4 = new_apply_data::app_zero.type;
  local_8->valid = new_apply_data::app_zero.valid;
  local_8->field_0x1 = uVar1;
  local_8->location = sVar2;
  local_8->modifier = sVar3;
  local_8->type = sVar4;
  local_8->next = new_apply_data::app_zero.next;
  local_8->type = 0;
  local_8->valid = true;
  return local_8;
}

Assistant:

OBJ_APPLY_DATA *new_apply_data(void)
{
	static OBJ_APPLY_DATA app_zero;
	OBJ_APPLY_DATA *app;

	if (apply_free == nullptr)
	{
		app = new OBJ_APPLY_DATA;
	}
	else
	{
		app = apply_free;
		apply_free = apply_free->next;
	}

	*app = app_zero;
	app->type = 0;

	app->valid = true;
	return app;
}